

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterMain.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string filename;
  Interpreter interpreter;
  ifstream ifs;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  if ((uint)argc < 2) {
    puts("Type filename:");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&filename);
  }
  else {
    std::__cxx11::string::string((string *)&ifs,argv[1],(allocator *)&interpreter);
    std::__cxx11::string::operator=((string *)&filename,(string *)&ifs);
    std::__cxx11::string::~string((string *)&ifs);
  }
  std::ifstream::ifstream(&ifs,(string *)&filename,_S_in);
  Interpreter::Interpreter(&interpreter,&ifs);
  Interpreter::load(&interpreter);
  Interpreter::run(&interpreter);
  Interpreter::~Interpreter(&interpreter);
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&filename);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string filename;
    if (argc == 0 || argc == 1) {
        printf("Type filename:\n");
        getline(std::cin, filename);
    } else {
        filename = std::string(argv[1]);
    }

    std::ifstream ifs(filename);
    Interpreter interpreter(ifs);

    interpreter.load();

#ifdef MEASURE_TIME
#ifdef MEASURE_TIME_MILLIS
    long time = getCurrentTime();
#else
    clock_t time = clock();
#endif
    for (int i = 0; i < MEASURE_COUNT; i++) {
        interpreter.setOpPos(0);
#endif

        interpreter.run();

#ifdef MEASURE_TIME
    }
#ifdef MEASURE_TIME_MILLIS
    time = getCurrentTime() - time;
#else
    time = clock() - time;
#endif
    printf("completed %i iterations in %li\n", MEASURE_COUNT, time);
#endif

    return 0;
}